

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_stream.hpp
# Opt level: O0

void __thiscall
libtorrent::ssl_stream<libtorrent::http_stream>::
async_connect<std::_Bind<void(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>>
          (ssl_stream<libtorrent::http_stream> *this,endpoint_type *endpoint,
          _Bind<void_(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
          *handler)

{
  next_layer_type *this_00;
  ssl_stream<libtorrent::http_stream> *local_80;
  code *local_78;
  undefined8 local_70;
  type local_68;
  undefined1 local_30 [8];
  shared_ptr<std::function<void_(const_boost::system::error_code_&)>_> h;
  _Bind<void_(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
  *handler_local;
  endpoint_type *endpoint_local;
  ssl_stream<libtorrent::http_stream> *this_local;
  
  h.
  super___shared_ptr<std::function<void_(const_boost::system::error_code_&)>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)handler;
  std::
  make_shared<std::function<void(boost::system::error_code_const&)>,std::_Bind<void(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,std::_Placeholder<1>))(boost::system::error_code_const&)>const&>
            ((_Bind<void_(libtorrent::http_connection::*(std::shared_ptr<libtorrent::http_connection>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
              *)local_30);
  this_00 = boost::asio::ssl::stream<libtorrent::http_stream>::next_layer(&this->m_sock);
  local_78 = connected;
  local_70 = 0;
  local_80 = this;
  std::
  bind<void(libtorrent::ssl_stream<libtorrent::http_stream>::*)(boost::system::error_code_const&,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>),libtorrent::ssl_stream<libtorrent::http_stream>*,std::_Placeholder<1>const&,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>&>
            (&local_68,(offset_in_ssl_stream<libtorrent::http_stream>_to_subr *)&local_78,&local_80,
             (_Placeholder<1> *)&std::placeholders::_1,
             (shared_ptr<std::function<void_(const_boost::system::error_code_&)>_> *)local_30);
  http_stream::
  async_connect<std::_Bind<void(libtorrent::ssl_stream<libtorrent::http_stream>::*(libtorrent::ssl_stream<libtorrent::http_stream>*,std::_Placeholder<1>,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>))(boost::system::error_code_const&,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>)>>
            (this_00,endpoint,&local_68);
  std::
  _Bind<void_(libtorrent::ssl_stream<libtorrent::http_stream>::*(libtorrent::ssl_stream<libtorrent::http_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>))(const_boost::system::error_code_&,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>)>
  ::~_Bind(&local_68);
  std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>::~shared_ptr
            ((shared_ptr<std::function<void_(const_boost::system::error_code_&)>_> *)local_30);
  return;
}

Assistant:

void async_connect(endpoint_type const& endpoint, Handler const& handler)
	{
		// the connect is split up in the following steps:
		// 1. connect to peer
		// 2. perform SSL client handshake

		// to avoid unnecessary copying of the handler,
		// store it in a shared_ptr
		auto h = std::make_shared<handler_type>(handler);

		using std::placeholders::_1;
		m_sock.next_layer().async_connect(endpoint
			, std::bind(&ssl_stream::connected, this, _1, h));
	}